

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O0

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<double,_double>,_Eigen::internal::redux_evaluator<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>,_3,_0>
       ::run(redux_evaluator<Eigen::Array<double,__1,_1,_0,__1,_1>_> *mat,
            scalar_sum_op<double,_double> *func)

{
  Index IVar1;
  DenseBase<Eigen::Array<double,__1,_1,_0,__1,_1>_> *m;
  CoeffReturnType pdVar2;
  double adVar3 [2];
  long local_e0;
  Index index_3;
  Index index_2;
  Index index_1;
  double local_b8 [2];
  double local_a8 [3];
  long local_90;
  Index index;
  PacketScalar packet_res1;
  PacketScalar packet_res0;
  double local_60;
  Scalar res;
  Index alignedEnd;
  Index alignedEnd2;
  Index alignedSize;
  Index alignedSize2;
  Index alignedStart;
  undefined8 uStack_28;
  int packetAlignment;
  Index packetSize;
  Index size;
  scalar_sum_op<double,_double> *func_local;
  redux_evaluator<Eigen::Array<double,__1,_1,_0,__1,_1>_> *mat_local;
  
  size = (Index)func;
  func_local = (scalar_sum_op<double,_double> *)mat;
  packetSize = redux_evaluator<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::size(mat);
  uStack_28 = 2;
  alignedStart._4_4_ = 0x10;
  m = (DenseBase<Eigen::Array<double,__1,_1,_0,__1,_1>_> *)
      redux_evaluator<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::nestedExpression
                ((redux_evaluator<Eigen::Array<double,__1,_1,_0,__1,_1>_> *)func_local);
  alignedSize2 = first_default_aligned<Eigen::Array<double,_1,1,0,_1,1>>(m);
  alignedSize = ((packetSize - alignedSize2) / 4) * 4;
  alignedEnd2 = ((packetSize - alignedSize2) / 2) * 2;
  alignedEnd = alignedSize2 + alignedSize;
  res = (Scalar)(alignedSize2 + alignedEnd2);
  if (alignedEnd2 == 0) {
    pdVar2 = redux_evaluator<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::coeff
                       ((redux_evaluator<Eigen::Array<double,__1,_1,_0,__1,_1>_> *)func_local,0);
    local_60 = *pdVar2;
    for (local_e0 = 1; IVar1 = size, local_e0 < packetSize; local_e0 = local_e0 + 1) {
      pdVar2 = redux_evaluator<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::coeff
                         ((redux_evaluator<Eigen::Array<double,__1,_1,_0,__1,_1>_> *)func_local,
                          local_e0);
      local_60 = scalar_sum_op<double,_double>::operator()
                           ((scalar_sum_op<double,_double> *)IVar1,&local_60,pdVar2);
    }
  }
  else {
    adVar3 = redux_evaluator<Eigen::Array<double,-1,1,0,-1,1>>::packet<16,double__vector(2)>
                       ((redux_evaluator<Eigen::Array<double,_1,1,0,_1,1>> *)func_local,alignedSize2
                       );
    packet_res1[1] = adVar3[0];
    if (2 < alignedEnd2) {
      adVar3 = redux_evaluator<Eigen::Array<double,-1,1,0,-1,1>>::packet<16,double__vector(2)>
                         ((redux_evaluator<Eigen::Array<double,_1,1,0,_1,1>> *)func_local,
                          alignedSize2 + 2);
      index = adVar3[0];
      local_90 = alignedSize2;
      while (IVar1 = size, local_90 = local_90 + 4, local_90 < alignedEnd) {
        adVar3 = redux_evaluator<Eigen::Array<double,-1,1,0,-1,1>>::packet<16,double__vector(2)>
                           ((redux_evaluator<Eigen::Array<double,_1,1,0,_1,1>> *)func_local,local_90
                           );
        local_a8[0] = adVar3[0];
        adVar3 = scalar_sum_op<double,double>::packetOp<double__vector(2)>
                           ((scalar_sum_op<double,double> *)IVar1,(double (*) [2])(packet_res1 + 1),
                            (double (*) [2])local_a8);
        IVar1 = size;
        packet_res1[1] = adVar3[0];
        adVar3 = redux_evaluator<Eigen::Array<double,-1,1,0,-1,1>>::packet<16,double__vector(2)>
                           ((redux_evaluator<Eigen::Array<double,_1,1,0,_1,1>> *)func_local,
                            local_90 + 2);
        local_b8[0] = adVar3[0];
        adVar3 = scalar_sum_op<double,double>::packetOp<double__vector(2)>
                           ((scalar_sum_op<double,double> *)IVar1,(double (*) [2])&index,&local_b8);
        index = adVar3[0];
      }
      adVar3 = scalar_sum_op<double,double>::packetOp<double__vector(2)>
                         ((scalar_sum_op<double,double> *)size,(double (*) [2])(packet_res1 + 1),
                          (double (*) [2])&index);
      IVar1 = size;
      packet_res1[1] = adVar3[0];
      if (alignedEnd < (long)res) {
        adVar3 = redux_evaluator<Eigen::Array<double,-1,1,0,-1,1>>::packet<16,double__vector(2)>
                           ((redux_evaluator<Eigen::Array<double,_1,1,0,_1,1>> *)func_local,
                            alignedEnd);
        index_1 = adVar3[0];
        adVar3 = scalar_sum_op<double,double>::packetOp<double__vector(2)>
                           ((scalar_sum_op<double,double> *)IVar1,(double (*) [2])(packet_res1 + 1),
                            (double (*) [2])&index_1);
        packet_res1[1] = adVar3[0];
      }
    }
    local_60 = scalar_sum_op<double,double>::predux<double__vector(2)>
                         ((scalar_sum_op<double,double> *)size,(double (*) [2])(packet_res1 + 1));
    for (index_2 = 0; IVar1 = size, index_2 < alignedSize2; index_2 = index_2 + 1) {
      pdVar2 = redux_evaluator<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::coeff
                         ((redux_evaluator<Eigen::Array<double,__1,_1,_0,__1,_1>_> *)func_local,
                          index_2);
      local_60 = scalar_sum_op<double,_double>::operator()
                           ((scalar_sum_op<double,_double> *)IVar1,&local_60,pdVar2);
    }
    for (index_3 = (Index)res; IVar1 = size, index_3 < packetSize; index_3 = index_3 + 1) {
      pdVar2 = redux_evaluator<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::coeff
                         ((redux_evaluator<Eigen::Array<double,__1,_1,_0,__1,_1>_> *)func_local,
                          index_3);
      local_60 = scalar_sum_op<double,_double>::operator()
                           ((scalar_sum_op<double,_double> *)IVar1,&local_60,pdVar2);
    }
  }
  return local_60;
}

Assistant:

static Scalar run(const Derived &mat, const Func& func)
  {
    const Index size = mat.size();
    
    const Index packetSize = redux_traits<Func, Derived>::PacketSize;
    const int packetAlignment = unpacket_traits<PacketScalar>::alignment;
    enum {
      alignment0 = (bool(Derived::Flags & DirectAccessBit) && bool(packet_traits<Scalar>::AlignedOnScalar)) ? int(packetAlignment) : int(Unaligned),
      alignment = EIGEN_PLAIN_ENUM_MAX(alignment0, Derived::Alignment)
    };
    const Index alignedStart = internal::first_default_aligned(mat.nestedExpression());
    const Index alignedSize2 = ((size-alignedStart)/(2*packetSize))*(2*packetSize);
    const Index alignedSize = ((size-alignedStart)/(packetSize))*(packetSize);
    const Index alignedEnd2 = alignedStart + alignedSize2;
    const Index alignedEnd  = alignedStart + alignedSize;
    Scalar res;
    if(alignedSize)
    {
      PacketScalar packet_res0 = mat.template packet<alignment,PacketScalar>(alignedStart);
      if(alignedSize>packetSize) // we have at least two packets to partly unroll the loop
      {
        PacketScalar packet_res1 = mat.template packet<alignment,PacketScalar>(alignedStart+packetSize);
        for(Index index = alignedStart + 2*packetSize; index < alignedEnd2; index += 2*packetSize)
        {
          packet_res0 = func.packetOp(packet_res0, mat.template packet<alignment,PacketScalar>(index));
          packet_res1 = func.packetOp(packet_res1, mat.template packet<alignment,PacketScalar>(index+packetSize));
        }

        packet_res0 = func.packetOp(packet_res0,packet_res1);
        if(alignedEnd>alignedEnd2)
          packet_res0 = func.packetOp(packet_res0, mat.template packet<alignment,PacketScalar>(alignedEnd2));
      }
      res = func.predux(packet_res0);

      for(Index index = 0; index < alignedStart; ++index)
        res = func(res,mat.coeff(index));

      for(Index index = alignedEnd; index < size; ++index)
        res = func(res,mat.coeff(index));
    }
    else // too small to vectorize anything.
         // since this is dynamic-size hence inefficient anyway for such small sizes, don't try to optimize.
    {
      res = mat.coeff(0);
      for(Index index = 1; index < size; ++index)
        res = func(res,mat.coeff(index));
    }

    return res;
  }